

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O1

void __thiscall
mocker::ir::FunctionModule::FunctionModule(FunctionModule *this,FunctionModule *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BasicBlockList *pBVar3;
  BasicBlockList *pBVar4;
  pointer pcVar5;
  _List_node_base *p_Var6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  size_t sVar10;
  
  paVar1 = &(this->identifier).field_2;
  (this->identifier)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (param_1->identifier)._M_dataplus._M_p;
  paVar2 = &(param_1->identifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar9 = *(undefined8 *)((long)&(param_1->identifier).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->identifier).field_2 + 8) = uVar9;
  }
  else {
    (this->identifier)._M_dataplus._M_p = pcVar5;
    (this->identifier).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->identifier)._M_string_length = (param_1->identifier)._M_string_length;
  (param_1->identifier)._M_dataplus._M_p = (pointer)paVar2;
  (param_1->identifier)._M_string_length = 0;
  (param_1->identifier).field_2._M_local_buf[0] = '\0';
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->args).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_1->args).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->args).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar3 = &this->bbs;
  pBVar4 = &param_1->bbs;
  (this->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       (param_1->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  p_Var6 = (param_1->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_prev;
  (this->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
  _M_impl._M_node.super__List_node_base._M_prev = p_Var6;
  (this->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
  _M_impl._M_node._M_size =
       (param_1->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node._M_size;
  if ((param_1->bbs).
      super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)pBVar4) {
    (this->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pBVar3;
    (this->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pBVar3;
  }
  else {
    p_Var6->_M_next = (_List_node_base *)pBVar3;
    ((pBVar3->super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
     _M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)pBVar3;
    (param_1->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pBVar4;
    (param_1->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pBVar4;
    (param_1->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
    ._M_impl._M_node._M_size = 0;
  }
  this->isExternal = param_1->isExternal;
  uVar7 = *(undefined4 *)((long)&param_1->bbsSz + 4);
  sVar10 = param_1->tempRegCounter;
  uVar8 = *(undefined4 *)((long)&param_1->tempRegCounter + 4);
  *(int *)&this->bbsSz = (int)param_1->bbsSz;
  *(undefined4 *)((long)&this->bbsSz + 4) = uVar7;
  *(int *)&this->tempRegCounter = (int)sVar10;
  *(undefined4 *)((long)&this->tempRegCounter + 4) = uVar8;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->bbMap)._M_h,&param_1->bbMap);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->predecessors)._M_h,&param_1->predecessors,&param_1->predecessors);
  return;
}

Assistant:

FunctionModule(FunctionModule &&) = default;